

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

bool doctest::anon_unknown_14::parseOptionImpl(int argc,char **argv,char *pattern,String *value)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  anon_union_24_2_13149d16_for_String_2 local_48;
  
  if (0 < argc) {
    uVar8 = (ulong)(uint)argc;
    do {
      pcVar2 = argv[uVar8 - 1];
      pcVar4 = strstr(pcVar2,pattern);
      if (pcVar4 != (char *)0x0) {
        pcVar7 = pcVar2;
        if (value == (String *)0x0) {
          sVar5 = strlen(pcVar4);
          sVar6 = strlen(pattern);
          if (sVar5 != sVar6) goto LAB_00116219;
        }
        do {
          if (pcVar7 == pcVar4) {
            if (*pcVar2 == '-') {
              if (value == (String *)0x0) {
                return true;
              }
              sVar5 = strlen(pattern);
              pcVar4 = pcVar4 + sVar5;
              sVar5 = strlen(pcVar4);
              if ((int)sVar5 != 0) {
                sVar5 = strlen(pcVar4);
                String::String((String *)&local_48.data,pcVar4,(uint)sVar5);
                if (((value->field_0).buf[0x17] < '\0') &&
                   (pcVar2 = (value->field_0).data.ptr, pcVar2 != (char *)0x0)) {
                  operator_delete__(pcVar2);
                }
                *(undefined8 *)((long)&value->field_0 + 0x10) = local_48._16_8_;
                (value->field_0).data.ptr = local_48.data.ptr;
                *(undefined8 *)((long)&value->field_0 + 8) = local_48._8_8_;
                return true;
              }
            }
            break;
          }
          cVar1 = *pcVar7;
          pcVar7 = pcVar7 + 1;
        } while (cVar1 == '-');
      }
LAB_00116219:
      bVar3 = 1 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar3);
  }
  return false;
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String* value) {
        // going from the end to the beginning and stopping on the first occurrence from the end
        for(int i = argc; i > 0; --i) {
            auto index = i - 1;
            auto temp = std::strstr(argv[index], pattern);
            if(temp && (value || strlen(temp) == strlen(pattern))) { //!OCLINT prefer early exits and continue
                // eliminate matches in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                auto curr            = argv[index];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[index][0] == '-') {
                    if(value) {
                        // parsing the value of an option
                        temp += strlen(pattern);
                        const unsigned len = strlen(temp);
                        if(len) {
                            *value = temp;
                            return true;
                        }
                    } else {
                        // just a flag - no value
                        return true;
                    }
                }
            }
        }
        return false;
    }